

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
::find_impl<cs::signal_types>
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
           *this,key_arg<cs::signal_types> *key,size_t hashval,size_t *offset)

{
  bool bVar1;
  uint32_t uVar2;
  size_t sVar3;
  size_t *in_RCX;
  size_t in_RDX;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
  *in_RSI;
  EqualElement<cs::signal_types> *in_RDI;
  uint32_t i;
  BitMask<unsigned_int,_16,_0> __end4;
  BitMask<unsigned_int,_16,_0> __begin4;
  BitMask<unsigned_int,_16,_0> *__range4;
  Group g;
  probe_seq<16UL> seq;
  GroupSse2Impl *this_00;
  undefined4 in_stack_ffffffffffffff78;
  BitMask<unsigned_int,_16,_0> in_stack_ffffffffffffff7c;
  h2_t hash;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
  *in_stack_ffffffffffffff80;
  BitMask<unsigned_int,_16,_0> local_6c;
  BitMask<unsigned_int,_16,_0> local_68;
  BitMask<unsigned_int,_16,_0> local_64;
  BitMask<unsigned_int,_16,_0> *local_60;
  GroupSse2Impl local_58;
  probe_seq<16UL> local_40;
  size_t *local_28;
  size_t local_20;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
  *local_18;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  probe(in_stack_ffffffffffffff80,
        CONCAT44(in_stack_ffffffffffffff7c.mask_,in_stack_ffffffffffffff78));
  do {
    hash = (h2_t)(in_stack_ffffffffffffff7c.mask_ >> 0x18);
    this_00 = (GroupSse2Impl *)in_RDI->rhs;
    sVar3 = probe_seq<16UL>::offset(&local_40);
    GroupSse2Impl::GroupSse2Impl(&local_58,(ctrl_t *)((long)this_00->ctrl + sVar3));
    H2(local_20);
    local_64 = GroupSse2Impl::Match((GroupSse2Impl *)in_stack_ffffffffffffff80,hash);
    local_60 = &local_64;
    local_68 = BitMask<unsigned_int,_16,_0>::begin(local_60);
    local_6c = BitMask<unsigned_int,_16,_0>::end((BitMask<unsigned_int,_16,_0> *)this_00);
    while (bVar1 = priv::operator!=(&local_68,&local_6c), bVar1) {
      uVar2 = BitMask<unsigned_int,_16,_0>::operator*((BitMask<unsigned_int,_16,_0> *)0x5ce2c7);
      sVar3 = probe_seq<16UL>::offset(&local_40,(ulong)uVar2);
      *local_28 = sVar3;
      in_stack_ffffffffffffff80 = local_18;
      eq_ref((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
              *)0x5ce2fd);
      hash_policy_traits<phmap::priv::FlatHashSetPolicy<cs::signal_types>,void>::
      element<phmap::priv::FlatHashSetPolicy<cs::signal_types>>((slot_type *)0x5ce322);
      bVar1 = hash_policy_traits<phmap::priv::FlatHashSetPolicy<cs::signal_types>,void>::
              apply<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,phmap::Hash<cs::signal_types>,phmap::EqualTo<cs::signal_types>,std::allocator<cs::signal_types>>::EqualElement<cs::signal_types>,cs::signal_types&,phmap::priv::FlatHashSetPolicy<cs::signal_types>>
                        (in_RDI,(signal_types *)this_00);
      if (bVar1) {
        return true;
      }
      BitMask<unsigned_int,_16,_0>::operator++(&local_68);
    }
    in_stack_ffffffffffffff7c = GroupSse2Impl::MatchEmpty(this_00);
    bVar1 = BitMask::operator_cast_to_bool((BitMask *)&stack0xffffffffffffff7c);
    if (bVar1) {
      return false;
    }
    probe_seq<16UL>::next(&local_40);
  } while( true );
}

Assistant:

bool find_impl(const key_arg<K>& key, size_t hashval, size_t& offset)
			{
				auto seq = probe(hashval);
				while (true) {
					Group g{ ctrl_ + seq.offset() };
					for (uint32_t i : g.Match((h2_t)H2(hashval))) {
						offset = seq.offset((size_t)i);
						if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
						                           EqualElement<K> {key, eq_ref()},
						                           PolicyTraits::element(slots_ + offset))))
							return true;
					}
					if (PHMAP_PREDICT_TRUE(g.MatchEmpty()))
						return false;
					seq.next();
				}
			}